

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::SetCompilerFlags
          (cmGhsMultiTargetGenerator *this,string *config,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalGenerator *pcVar3;
  pointer pcVar4;
  cmLocalGhsMultiGenerator *pcVar5;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  int iVar6;
  iterator iVar7;
  value_type entry;
  string flags;
  allocator<char> local_a1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char *local_60;
  string local_58;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_38;
  
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->FlagsByLanguage)._M_t,language);
  if ((_Rb_tree_header *)iVar7._M_node ==
      &(this->FlagsByLanguage)._M_t._M_impl.super__Rb_tree_header) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_60 = (language->_M_dataplus)._M_p;
    pcVar2 = this->GeneratorTarget;
    pcVar3 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,local_60,&local_a1);
    cmLocalGenerator::AddLanguageFlags(pcVar3,&local_58,pcVar2,&local_a0.first,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->GeneratorTarget;
    pcVar3 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,local_60,&local_a1);
    cmLocalGenerator::AddCMP0018Flags(pcVar3,&local_58,pcVar2,&local_a0.first,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->GeneratorTarget;
    pcVar3 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,local_60,&local_a1);
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->FlagsByLanguage;
    cmLocalGenerator::AddVisibilityPresetFlags(pcVar3,&local_58,pcVar2,&local_a0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_a0.first.field_2;
    pcVar4 = (this->Makefile->DefineFlags)._M_dataplus._M_p;
    local_a0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar4,pcVar4 + (this->Makefile->DefineFlags)._M_string_length);
    iVar6 = std::__cxx11::string::compare((char *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_38;
    if (iVar6 != 0) {
      pcVar5 = this->LocalGenerator;
      local_a0.first._M_dataplus._M_p = (pointer)&local_a0.first.field_2;
      pcVar4 = (this->Makefile->DefineFlags)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar4,pcVar4 + (this->Makefile->DefineFlags)._M_string_length)
      ;
      (*(pcVar5->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar5,&local_58,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
        operator_delete(local_a0.first._M_dataplus._M_p,
                        local_a0.first.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar2 = this->GeneratorTarget;
    pcVar3 = &this->LocalGenerator->super_cmLocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,local_60,&local_a1);
    cmLocalGenerator::AddCompileOptions(pcVar3,&local_58,pcVar2,&local_a0.first,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_a0,language,&local_58);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
              (this_00,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.second._M_dataplus._M_p != &local_a0.second.field_2) {
      operator_delete(local_a0.second._M_dataplus._M_p,
                      local_a0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::SetCompilerFlags(std::string const& config,
                                                 const std::string& language)
{
  std::map<std::string, std::string>::iterator i =
    this->FlagsByLanguage.find(language);
  if (i == this->FlagsByLanguage.end()) {
    std::string flags;
    const char* lang = language.c_str();

    this->LocalGenerator->AddLanguageFlags(flags, this->GeneratorTarget, lang,
                                           config);

    this->LocalGenerator->AddCMP0018Flags(flags, this->GeneratorTarget, lang,
                                          config);
    this->LocalGenerator->AddVisibilityPresetFlags(
      flags, this->GeneratorTarget, lang);

    // Append old-style preprocessor definition flags.
    if (this->Makefile->GetDefineFlags() != " ") {
      this->LocalGenerator->AppendFlags(flags,
                                        this->Makefile->GetDefineFlags());
    }

    // Add target-specific flags.
    this->LocalGenerator->AddCompileOptions(flags, this->GeneratorTarget, lang,
                                            config);

    std::map<std::string, std::string>::value_type entry(language, flags);
    i = this->FlagsByLanguage.insert(entry).first;
  }
}